

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockchain.cpp
# Opt level: O2

RPCHelpMan * getblockchaininfo(void)

{
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  string m_key_name_02;
  string m_key_name_03;
  string m_key_name_04;
  string m_key_name_05;
  string m_key_name_06;
  string m_key_name_07;
  string m_key_name_08;
  string m_key_name_09;
  string m_key_name_10;
  string m_key_name_11;
  string m_key_name_12;
  string m_key_name_13;
  string m_key_name_14;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  string description_04;
  string description_05;
  string description_06;
  string description_07;
  string description_08;
  string description_09;
  string description_10;
  string description_11;
  string description_12;
  string description_13;
  string description_14;
  string description_15;
  string description_16;
  string description_17;
  string description_18;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_03;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_04;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_05;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_06;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_07;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_08;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_09;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_10;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_11;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_12;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_13;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_14;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_15;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_16;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_17;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCExamples examples;
  RPCMethodImpl fun;
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  bool bVar4;
  long lVar5;
  RPCHelpMan *in_RDI;
  string *this;
  long in_FS_OFFSET;
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  undefined4 in_stack_ffffffffffffed38;
  undefined4 uVar6;
  undefined4 in_stack_ffffffffffffed3c;
  undefined8 in_stack_ffffffffffffed40;
  undefined8 in_stack_ffffffffffffed48;
  undefined8 in_stack_ffffffffffffed50;
  _Manager_type in_stack_ffffffffffffed58;
  undefined8 in_stack_ffffffffffffed60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_ffffffffffffed68;
  pointer in_stack_ffffffffffffed78;
  pointer in_stack_ffffffffffffed80;
  pointer in_stack_ffffffffffffed88;
  _Vector_impl_data in_stack_ffffffffffffed90;
  undefined1 in_stack_ffffffffffffeda8 [16];
  pointer in_stack_ffffffffffffedb8;
  pointer in_stack_ffffffffffffedc0;
  pointer in_stack_ffffffffffffedc8;
  undefined8 in_stack_ffffffffffffedd0;
  pointer pRVar7;
  pointer pRVar8;
  allocator<char> local_120a;
  allocator<char> local_1209;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1208;
  allocator<char> local_11ea;
  allocator<char> local_11e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11e8;
  allocator<char> local_11ca;
  allocator<char> local_11c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11c8;
  allocator<char> local_11aa;
  allocator<char> local_11a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_11a8;
  allocator<char> local_118a;
  allocator<char> local_1189;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1188;
  allocator<char> local_116a;
  allocator<char> local_1169;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1168;
  allocator<char> local_114a;
  allocator<char> local_1149;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1148;
  allocator<char> local_112a;
  allocator<char> local_1129;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1128;
  allocator<char> local_1109;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1108;
  allocator<char> local_10e9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10e8;
  allocator<char> local_10ca;
  allocator<char> local_10c9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10c8;
  allocator<char> local_10aa;
  allocator<char> local_10a9;
  vector<RPCResult,_std::allocator<RPCResult>_> local_10a8;
  allocator<char> local_108a;
  allocator<char> local_1089;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1088;
  allocator<char> local_106a;
  allocator<char> local_1069;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1068;
  allocator<char> local_1042;
  allocator<char> local_1041;
  vector<RPCResult,_std::allocator<RPCResult>_> local_1040;
  undefined8 local_1028;
  RPCResults local_1020;
  vector<RPCArg,_std::allocator<RPCArg>_> local_1008;
  allocator<char> local_fe2;
  allocator<char> local_fe1;
  string local_fe0;
  string local_fc0;
  string local_fa0;
  string local_f80;
  string local_f60;
  string local_f40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f20;
  char *local_f00;
  size_type local_ef8;
  char local_ef0 [8];
  undefined8 uStack_ee8;
  string local_ee0 [32];
  string local_ec0 [32];
  RPCResult local_ea0;
  string local_e18 [32];
  string local_df8 [32];
  string local_dd8 [32];
  string local_db8 [32];
  string local_d98;
  string local_d78 [32];
  string local_d58 [32];
  string local_d38 [32];
  string local_d18 [32];
  string local_cf8 [32];
  string local_cd8 [32];
  string local_cb8 [32];
  string local_c98 [32];
  string local_c78 [32];
  string local_c58 [32];
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [32];
  string local_bd8 [32];
  string local_bb8 [32];
  string local_b98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b78;
  string local_b58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b38;
  string local_b18 [32];
  string local_af8 [32];
  string local_ad8 [32];
  string local_ab8 [32];
  string local_a98 [32];
  string local_a78 [32];
  string local_a58 [32];
  string local_a38 [32];
  string local_a18 [32];
  string local_9f8 [32];
  string local_9d8 [32];
  RPCResult local_9b8 [4];
  RPCResult local_798;
  RPCResult local_710;
  RPCResult local_688;
  RPCResult local_600;
  RPCResult local_578;
  RPCResult local_4f0;
  RPCResult local_468;
  RPCResult local_3e0;
  RPCResult local_358;
  RPCResult local_2d0;
  RPCResult local_248;
  RPCResult local_1c0;
  string local_138 [32];
  string local_118 [32];
  RPCResult local_f8;
  string local_70 [32];
  string local_50 [32];
  long local_30;
  
  local_1028 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>(local_50,"getblockchaininfo",&local_fe1);
  std::__cxx11::string::string<std::allocator<char>>
            (local_70,
             "Returns an object containing various state info regarding blockchain processing.\n",
             &local_fe2);
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_1008.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"",(allocator<char> *)((long)&local_1028 + 7));
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"",(allocator<char> *)((long)&local_1028 + 6));
  std::__cxx11::string::string<std::allocator<char>>(local_9d8,"chain",&local_1041);
  std::__cxx11::string::string<std::allocator<char>>
            (local_9f8,"current network name (main, test, testnet4, signet, regtest)",&local_1042);
  local_1068.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1068.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1068.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name._M_string_length = in_stack_ffffffffffffed40;
  m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name.field_2._8_8_ = in_stack_ffffffffffffed50;
  description._M_string_length = in_stack_ffffffffffffed60;
  description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description.field_2 = in_stack_ffffffffffffed68;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_ffffffffffffed80;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_ffffffffffffed78;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(local_9b8,STR,m_key_name,description,inner,SUB81(local_9d8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a18,"blocks",&local_1069);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a38,
             "the height of the most-work fully-validated chain. The genesis block has height 0",
             &local_106a);
  local_1088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1088.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_00._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_00.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_00._M_string_length = in_stack_ffffffffffffed60;
  description_00._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_00.field_2 = in_stack_ffffffffffffed68;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(local_9b8 + 1,NUM,m_key_name_00,description_00,inner_00,SUB81(local_a18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a58,"headers",&local_1089);
  std::__cxx11::string::string<std::allocator<char>>
            (local_a78,"the current number of headers we have validated",&local_108a);
  local_10a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_01._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_01._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_01.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_01._M_string_length = in_stack_ffffffffffffed60;
  description_01._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_01.field_2 = in_stack_ffffffffffffed68;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(local_9b8 + 2,NUM,m_key_name_01,description_01,inner_01,SUB81(local_a58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_a98,"bestblockhash",&local_10a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_ab8,"the hash of the currently best block",&local_10aa);
  local_10c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_02._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_02._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_02._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_02.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_02.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_02._M_string_length = in_stack_ffffffffffffed60;
  description_02._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_02.field_2 = in_stack_ffffffffffffed68;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(local_9b8 + 3,STR,m_key_name_02,description_02,inner_02,SUB81(local_a98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_ad8,"difficulty",&local_10c9);
  std::__cxx11::string::string<std::allocator<char>>(local_af8,"the current difficulty",&local_10ca)
  ;
  local_10e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_10e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_10e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_03._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_03._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_03._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_03.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_03.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_03._M_string_length = in_stack_ffffffffffffed60;
  description_03._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_03.field_2 = in_stack_ffffffffffffed68;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_03.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_798,NUM,m_key_name_03,description_03,inner_03,SUB81(local_ad8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_b18,"time",&local_10e9);
  std::operator+(&local_b38,"The block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1108.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_04._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_04._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_04._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_04.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_04.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_04._M_string_length = in_stack_ffffffffffffed60;
  description_04._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_04.field_2 = in_stack_ffffffffffffed68;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_04.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_710,NUM_TIME,m_key_name_04,description_04,inner_04,SUB81(local_b18,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_b58,"mediantime",&local_1109);
  std::operator+(&local_b78,"The median block time expressed in ",&UNIX_EPOCH_TIME_abi_cxx11_);
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1128.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_05._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_05._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_05._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_05.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_05.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_05._M_string_length = in_stack_ffffffffffffed60;
  description_05._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_05.field_2 = in_stack_ffffffffffffed68;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_05.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_688,NUM_TIME,m_key_name_05,description_05,inner_05,SUB81(local_b58,0))
  ;
  std::__cxx11::string::string<std::allocator<char>>(local_b98,"verificationprogress",&local_1129);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bb8,"estimate of verification progress [0..1]",&local_112a);
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1148.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_06._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_06._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_06._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_06.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_06.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_06._M_string_length = in_stack_ffffffffffffed60;
  description_06._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_06.field_2 = in_stack_ffffffffffffed68;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_06.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_600,NUM,m_key_name_06,description_06,inner_06,SUB81(local_b98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_bd8,"initialblockdownload",&local_1149);
  std::__cxx11::string::string<std::allocator<char>>
            (local_bf8,
             "(debug information) estimate of whether this node is in Initial Block Download mode",
             &local_114a);
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1168.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_07._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_07._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_07._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_07.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_07.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_07._M_string_length = in_stack_ffffffffffffed60;
  description_07._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_07.field_2 = in_stack_ffffffffffffed68;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_07.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_578,BOOL,m_key_name_07,description_07,inner_07,SUB81(local_bd8,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c18,"chainwork",&local_1169);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c38,"total amount of work in active chain, in hexadecimal",&local_116a);
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1188.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_08._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_08._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_08._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_08.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_08.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_08._M_string_length = in_stack_ffffffffffffed60;
  description_08._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_08.field_2 = in_stack_ffffffffffffed68;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_08.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_4f0,STR_HEX,m_key_name_08,description_08,inner_08,SUB81(local_c18,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c58,"size_on_disk",&local_1189);
  std::__cxx11::string::string<std::allocator<char>>
            (local_c78,"the estimated size of the block and undo files on disk",&local_118a);
  local_11a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11a8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_09._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_09._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_09._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_09.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_09.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_09._M_string_length = in_stack_ffffffffffffed60;
  description_09._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_09.field_2 = in_stack_ffffffffffffed68;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_09.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_468,NUM,m_key_name_09,description_09,inner_09,SUB81(local_c58,0));
  std::__cxx11::string::string<std::allocator<char>>(local_c98,"pruned",&local_11a9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_cb8,"if the blocks are subject to pruning",&local_11aa);
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11c8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  m_key_name_10._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_10._M_dataplus._M_p._0_4_ = in_stack_ffffffffffffed38;
  m_key_name_10._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_10.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_10.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_10._M_string_length = in_stack_ffffffffffffed60;
  description_10._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_10.field_2 = in_stack_ffffffffffffed68;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_10.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_3e0,BOOL,m_key_name_10,description_10,inner_10,SUB81(local_c98,0));
  std::__cxx11::string::string<std::allocator<char>>(local_cd8,"pruneheight",&local_11c9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_cf8,
             "height of the last block pruned, plus one (only present if pruning is enabled)",
             &local_11ca);
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_11e8.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar1._4_8_ = in_stack_ffffffffffffed40;
  auVar1._0_4_ = in_stack_ffffffffffffed3c;
  auVar1._12_8_ = in_stack_ffffffffffffed48;
  auVar1._20_8_ = in_stack_ffffffffffffed50;
  auVar1._28_4_ = 0;
  description_11._M_string_length = in_stack_ffffffffffffed60;
  description_11._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_11.field_2 = in_stack_ffffffffffffed68;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_11.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult
            (&local_358,NUM,(string)(auVar1 << 0x20),SUB81(local_cd8,0),description_11,inner_11,true
            );
  std::__cxx11::string::string<std::allocator<char>>(local_d18,"automatic_pruning",&local_11e9);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d38,"whether automatic pruning is enabled (only present if pruning is enabled)",
             &local_11ea);
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1208.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auVar2._4_8_ = in_stack_ffffffffffffed40;
  auVar2._0_4_ = in_stack_ffffffffffffed3c;
  auVar2._12_8_ = in_stack_ffffffffffffed48;
  auVar2._20_8_ = in_stack_ffffffffffffed50;
  auVar2._28_4_ = 0;
  description_12._M_string_length = in_stack_ffffffffffffed60;
  description_12._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_12.field_2 = in_stack_ffffffffffffed68;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_12.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult
            (&local_2d0,BOOL,(string)(auVar2 << 0x20),SUB81(local_d18,0),description_12,inner_12,
             true);
  std::__cxx11::string::string<std::allocator<char>>(local_d58,"prune_target_size",&local_1209);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d78,
             "the target size used by pruning (only present if automatic pruning is enabled)",
             &local_120a);
  pRVar7 = (pointer)0x0;
  pRVar8 = (pointer)0x0;
  uVar6 = 0;
  auVar3._4_8_ = in_stack_ffffffffffffed40;
  auVar3._0_4_ = in_stack_ffffffffffffed3c;
  auVar3._12_8_ = in_stack_ffffffffffffed48;
  auVar3._20_8_ = in_stack_ffffffffffffed50;
  auVar3._28_4_ = 0;
  description_13._M_string_length = in_stack_ffffffffffffed60;
  description_13._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_13.field_2 = in_stack_ffffffffffffed68;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_13.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult
            (&local_248,NUM,(string)(auVar3 << 0x20),SUB81(local_d58,0),description_13,inner_13,true
            );
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d98,"warnings",(allocator<char> *)&stack0xffffffffffffedd7);
  bVar4 = IsDeprecatedRPCEnabled(&local_d98);
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_db8,"warnings",(allocator<char> *)&local_ea0);
    std::__cxx11::string::string<std::allocator<char>>
              (local_dd8,"any network and blockchain warnings (DEPRECATED)",
               (allocator<char> *)&stack0xffffffffffffedd6);
    in_stack_ffffffffffffedb8 = (pointer)0x0;
    in_stack_ffffffffffffedc0 = (pointer)0x0;
    in_stack_ffffffffffffedc8 = (pointer)0x0;
    m_key_name_11._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
    m_key_name_11._M_dataplus._M_p._0_4_ = uVar6;
    m_key_name_11._M_string_length = in_stack_ffffffffffffed40;
    m_key_name_11.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
    m_key_name_11.field_2._8_8_ = in_stack_ffffffffffffed50;
    description_14._M_string_length = in_stack_ffffffffffffed60;
    description_14._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
    description_14.field_2 = in_stack_ffffffffffffed68;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffed80;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_ffffffffffffed78;
    inner_14.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
    RPCResult::RPCResult(&local_1c0,STR,m_key_name_11,description_14,inner_14,SUB81(local_db8,0));
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              (local_df8,"warnings",(allocator<char> *)&stack0xffffffffffffedd6);
    std::__cxx11::string::string<std::allocator<char>>
              (local_e18,
               "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)"
               ,(allocator<char> *)&stack0xffffffffffffedb7);
    std::__cxx11::string::string<std::allocator<char>>
              (local_ec0,"",(allocator<char> *)&stack0xffffffffffffed97);
    std::__cxx11::string::string<std::allocator<char>>
              (local_ee0,"warning",(allocator<char> *)&stack0xffffffffffffed96);
    in_stack_ffffffffffffed78 = (pointer)0x0;
    in_stack_ffffffffffffed80 = (pointer)0x0;
    in_stack_ffffffffffffed88 = (pointer)0x0;
    m_key_name_12._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
    m_key_name_12._M_dataplus._M_p._0_4_ = uVar6;
    m_key_name_12._M_string_length = in_stack_ffffffffffffed40;
    m_key_name_12.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
    m_key_name_12.field_2._8_8_ = in_stack_ffffffffffffed50;
    description_15._M_string_length = in_stack_ffffffffffffed60;
    description_15._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
    description_15.field_2 = in_stack_ffffffffffffed68;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    inner_15.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    RPCResult::RPCResult(&local_ea0,STR,m_key_name_12,description_15,inner_15,SUB81(local_ec0,0));
    __l._M_len = 1;
    __l._M_array = &local_ea0;
    std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed98,__l,
               (allocator_type *)&stack0xffffffffffffed77);
    m_key_name_13._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
    m_key_name_13._M_dataplus._M_p._0_4_ = uVar6;
    m_key_name_13._M_string_length = in_stack_ffffffffffffed40;
    m_key_name_13.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
    m_key_name_13.field_2._8_8_ = in_stack_ffffffffffffed50;
    description_16._M_string_length = in_stack_ffffffffffffed60;
    description_16._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
    description_16.field_2._M_local_buf = in_stack_ffffffffffffed68._M_local_buf;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_finish = in_stack_ffffffffffffed80;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_start = in_stack_ffffffffffffed78;
    inner_16.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
    RPCResult::RPCResult(&local_1c0,ARR,m_key_name_13,description_16,inner_16,SUB81(local_df8,0));
  }
  __l_00._M_len = 0x10;
  __l_00._M_array = local_9b8;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            (&local_1040,__l_00,(allocator_type *)&stack0xffffffffffffed76);
  m_key_name_14._M_dataplus._M_p._4_4_ = in_stack_ffffffffffffed3c;
  m_key_name_14._M_dataplus._M_p._0_4_ = uVar6;
  m_key_name_14._M_string_length = in_stack_ffffffffffffed40;
  m_key_name_14.field_2._M_allocated_capacity = in_stack_ffffffffffffed48;
  m_key_name_14.field_2._8_8_ = in_stack_ffffffffffffed50;
  description_17._M_string_length = in_stack_ffffffffffffed60;
  description_17._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed58;
  description_17.field_2 = in_stack_ffffffffffffed68;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_ffffffffffffed80;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_ffffffffffffed78;
  inner_17.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)in_stack_ffffffffffffed88;
  RPCResult::RPCResult(&local_f8,OBJ,m_key_name_14,description_17,inner_17,SUB81(local_118,0));
  result._4_4_ = in_stack_ffffffffffffed3c;
  result.m_type = uVar6;
  result.m_key_name._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed40;
  result.m_key_name._M_string_length = in_stack_ffffffffffffed48;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_ffffffffffffed50;
  result.m_key_name.field_2._8_8_ = in_stack_ffffffffffffed58;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffed60;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_ffffffffffffed68;
  result._64_8_ = in_stack_ffffffffffffed78;
  result.m_description._M_dataplus._M_p = (pointer)in_stack_ffffffffffffed80;
  result.m_description._M_string_length = (size_type)in_stack_ffffffffffffed88;
  result._88_24_ = in_stack_ffffffffffffed90;
  result.m_cond._8_16_ = in_stack_ffffffffffffeda8;
  result.m_cond.field_2._8_8_ = in_stack_ffffffffffffedb8;
  RPCResults::RPCResults(&local_1020,result);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f60,"getblockchaininfo",(allocator<char> *)&stack0xffffffffffffed75);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f80,"",(allocator<char> *)&stack0xffffffffffffed74);
  HelpExampleCli(&local_f40,&local_f60,&local_f80);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fc0,"getblockchaininfo",(allocator<char> *)&stack0xffffffffffffed73);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_fe0,"",(allocator<char> *)&stack0xffffffffffffed72);
  HelpExampleRpc(&local_fa0,&local_fc0,&local_fe0);
  std::operator+(&local_f20,&local_f40,&local_fa0);
  local_f00 = local_ef0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f20._M_dataplus._M_p == &local_f20.field_2) {
    uStack_ee8 = local_f20.field_2._8_8_;
  }
  else {
    local_f00 = local_f20._M_dataplus._M_p;
  }
  local_ef8 = local_f20._M_string_length;
  local_f20._M_string_length = 0;
  local_f20.field_2._M_local_buf[0] = '\0';
  description_18._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1331:9)>
       ::_M_invoke;
  description_18._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/blockchain.cpp:1331:9)>
                ::_M_manager;
  description_18.field_2 = in_stack_ffffffffffffed68;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)in_stack_ffffffffffffed80;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)in_stack_ffffffffffffed78;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_ffffffffffffed88;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)in_stack_ffffffffffffedb8;
  examples.m_examples._M_dataplus._M_p = (pointer)in_stack_ffffffffffffeda8._0_8_;
  examples.m_examples._M_string_length = in_stack_ffffffffffffeda8._8_8_;
  examples.m_examples.field_2._8_8_ = in_stack_ffffffffffffedc0;
  fun.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffedd0;
  fun.super__Function_base._M_functor._M_unused._M_object = in_stack_ffffffffffffedc8;
  fun.super__Function_base._M_manager = (_Manager_type)pRVar7;
  fun._M_invoker = (_Invoker_type)pRVar8;
  local_f20._M_dataplus._M_p = (pointer)&local_f20.field_2;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_stack_ffffffffffffed40,&stack0xffffffffffffed48)),
             description_18,args,(RPCResults)in_stack_ffffffffffffed90,examples,fun);
  std::_Function_base::~_Function_base((_Function_base *)&stack0xffffffffffffed48);
  std::__cxx11::string::~string((string *)&local_f00);
  std::__cxx11::string::~string((string *)&local_f20);
  std::__cxx11::string::~string((string *)&local_fa0);
  std::__cxx11::string::~string((string *)&local_fe0);
  std::__cxx11::string::~string((string *)&local_fc0);
  std::__cxx11::string::~string((string *)&local_f40);
  std::__cxx11::string::~string((string *)&local_f80);
  std::__cxx11::string::~string((string *)&local_f60);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1020.m_results);
  RPCResult::~RPCResult(&local_f8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1040);
  lVar5 = 0x7f8;
  do {
    RPCResult::~RPCResult((RPCResult *)((long)&local_9b8[0].m_type + lVar5));
    lVar5 = lVar5 + -0x88;
  } while (lVar5 != -0x88);
  if (bVar4) {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedb8);
    std::__cxx11::string::~string(local_dd8);
    this = local_db8;
  }
  else {
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed98);
    RPCResult::~RPCResult(&local_ea0);
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffed78);
    std::__cxx11::string::~string(local_ee0);
    std::__cxx11::string::~string(local_ec0);
    std::__cxx11::string::~string(local_e18);
    this = local_df8;
  }
  std::__cxx11::string::~string(this);
  std::__cxx11::string::~string((string *)&local_d98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xffffffffffffedd8);
  std::__cxx11::string::~string(local_d78);
  std::__cxx11::string::~string(local_d58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1208);
  std::__cxx11::string::~string(local_d38);
  std::__cxx11::string::~string(local_d18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11e8);
  std::__cxx11::string::~string(local_cf8);
  std::__cxx11::string::~string(local_cd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11c8);
  std::__cxx11::string::~string(local_cb8);
  std::__cxx11::string::~string(local_c98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_11a8);
  std::__cxx11::string::~string(local_c78);
  std::__cxx11::string::~string(local_c58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1188);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_c18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1168);
  std::__cxx11::string::~string(local_bf8);
  std::__cxx11::string::~string(local_bd8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1148);
  std::__cxx11::string::~string(local_bb8);
  std::__cxx11::string::~string(local_b98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1128);
  std::__cxx11::string::~string((string *)&local_b78);
  std::__cxx11::string::~string(local_b58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1108);
  std::__cxx11::string::~string((string *)&local_b38);
  std::__cxx11::string::~string(local_b18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10e8);
  std::__cxx11::string::~string(local_af8);
  std::__cxx11::string::~string(local_ad8);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10c8);
  std::__cxx11::string::~string(local_ab8);
  std::__cxx11::string::~string(local_a98);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_10a8);
  std::__cxx11::string::~string(local_a78);
  std::__cxx11::string::~string(local_a58);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1088);
  std::__cxx11::string::~string(local_a38);
  std::__cxx11::string::~string(local_a18);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_1068);
  std::__cxx11::string::~string(local_9f8);
  std::__cxx11::string::~string(local_9d8);
  std::__cxx11::string::~string(local_138);
  std::__cxx11::string::~string(local_118);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector(&local_1008);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan getblockchaininfo()
{
    return RPCHelpMan{"getblockchaininfo",
        "Returns an object containing various state info regarding blockchain processing.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ, "", "",
            {
                {RPCResult::Type::STR, "chain", "current network name (" LIST_CHAIN_NAMES ")"},
                {RPCResult::Type::NUM, "blocks", "the height of the most-work fully-validated chain. The genesis block has height 0"},
                {RPCResult::Type::NUM, "headers", "the current number of headers we have validated"},
                {RPCResult::Type::STR, "bestblockhash", "the hash of the currently best block"},
                {RPCResult::Type::NUM, "difficulty", "the current difficulty"},
                {RPCResult::Type::NUM_TIME, "time", "The block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM_TIME, "mediantime", "The median block time expressed in " + UNIX_EPOCH_TIME},
                {RPCResult::Type::NUM, "verificationprogress", "estimate of verification progress [0..1]"},
                {RPCResult::Type::BOOL, "initialblockdownload", "(debug information) estimate of whether this node is in Initial Block Download mode"},
                {RPCResult::Type::STR_HEX, "chainwork", "total amount of work in active chain, in hexadecimal"},
                {RPCResult::Type::NUM, "size_on_disk", "the estimated size of the block and undo files on disk"},
                {RPCResult::Type::BOOL, "pruned", "if the blocks are subject to pruning"},
                {RPCResult::Type::NUM, "pruneheight", /*optional=*/true, "height of the last block pruned, plus one (only present if pruning is enabled)"},
                {RPCResult::Type::BOOL, "automatic_pruning", /*optional=*/true, "whether automatic pruning is enabled (only present if pruning is enabled)"},
                {RPCResult::Type::NUM, "prune_target_size", /*optional=*/true, "the target size used by pruning (only present if automatic pruning is enabled)"},
                (IsDeprecatedRPCEnabled("warnings") ?
                    RPCResult{RPCResult::Type::STR, "warnings", "any network and blockchain warnings (DEPRECATED)"} :
                    RPCResult{RPCResult::Type::ARR, "warnings", "any network and blockchain warnings (run with `-deprecatedrpc=warnings` to return the latest warning as a single string)",
                    {
                        {RPCResult::Type::STR, "", "warning"},
                    }
                    }
                ),
            }},
        RPCExamples{
            HelpExampleCli("getblockchaininfo", "")
            + HelpExampleRpc("getblockchaininfo", "")
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    ChainstateManager& chainman = EnsureAnyChainman(request.context);
    LOCK(cs_main);
    Chainstate& active_chainstate = chainman.ActiveChainstate();

    const CBlockIndex& tip{*CHECK_NONFATAL(active_chainstate.m_chain.Tip())};
    const int height{tip.nHeight};
    UniValue obj(UniValue::VOBJ);
    obj.pushKV("chain", chainman.GetParams().GetChainTypeString());
    obj.pushKV("blocks", height);
    obj.pushKV("headers", chainman.m_best_header ? chainman.m_best_header->nHeight : -1);
    obj.pushKV("bestblockhash", tip.GetBlockHash().GetHex());
    obj.pushKV("difficulty", GetDifficulty(tip));
    obj.pushKV("time", tip.GetBlockTime());
    obj.pushKV("mediantime", tip.GetMedianTimePast());
    obj.pushKV("verificationprogress", GuessVerificationProgress(chainman.GetParams().TxData(), &tip));
    obj.pushKV("initialblockdownload", chainman.IsInitialBlockDownload());
    obj.pushKV("chainwork", tip.nChainWork.GetHex());
    obj.pushKV("size_on_disk", chainman.m_blockman.CalculateCurrentUsage());
    obj.pushKV("pruned", chainman.m_blockman.IsPruneMode());
    if (chainman.m_blockman.IsPruneMode()) {
        const auto prune_height{GetPruneHeight(chainman.m_blockman, active_chainstate.m_chain)};
        obj.pushKV("pruneheight", prune_height ? prune_height.value() + 1 : 0);

        const bool automatic_pruning{chainman.m_blockman.GetPruneTarget() != BlockManager::PRUNE_TARGET_MANUAL};
        obj.pushKV("automatic_pruning",  automatic_pruning);
        if (automatic_pruning) {
            obj.pushKV("prune_target_size", chainman.m_blockman.GetPruneTarget());
        }
    }

    NodeContext& node = EnsureAnyNodeContext(request.context);
    obj.pushKV("warnings", node::GetWarningsForRpc(*CHECK_NONFATAL(node.warnings), IsDeprecatedRPCEnabled("warnings")));
    return obj;
},
    };
}